

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O2

void xmlXPtrEndPointFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  int *piVar2;
  int *piVar3;
  xmlXPathObjectPtr pxVar4;
  xmlXPathObjectPtr pxVar5;
  xmlLocationSetPtr val;
  int indx;
  xmlNodePtr node;
  long lVar6;
  int iStack_30;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    iStack_30 = 0xc;
    goto LAB_001e16c3;
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    iStack_30 = 0x17;
    goto LAB_001e16c3;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((xVar1 = ctxt->value->type, xVar1 != XPATH_NODESET && (xVar1 != XPATH_LOCATIONSET)))) {
    iStack_30 = 0xb;
    goto LAB_001e16c3;
  }
  pxVar4 = valuePop(ctxt);
  pxVar5 = pxVar4;
  if (pxVar4->type == XPATH_NODESET) {
    pxVar5 = xmlXPtrNewLocationSetNodeSet(pxVar4->nodesetval);
    xmlXPathFreeObject(pxVar4);
    if (pxVar5 != (xmlXPathObjectPtr)0x0) goto LAB_001e1603;
  }
  else {
LAB_001e1603:
    val = xmlXPtrLocationSetCreate((xmlXPathObjectPtr)0x0);
    if (val != (xmlLocationSetPtr)0x0) {
      piVar2 = (int *)pxVar5->user;
      if (piVar2 != (int *)0x0) {
        for (lVar6 = 0; lVar6 < *piVar2; lVar6 = lVar6 + 1) {
          piVar3 = *(int **)(*(long *)(piVar2 + 2) + lVar6 * 8);
          if (piVar3 != (int *)0x0) {
            if (*piVar3 == 6) {
              node = *(xmlNodePtr *)(piVar3 + 0xe);
              if (node != (xmlNodePtr)0x0) {
                if ((node->type | XML_ATTRIBUTE_DECL) != XML_NAMESPACE_DECL) {
                  indx = piVar3[0x10];
                  goto LAB_001e1665;
                }
                xmlXPathFreeObject(pxVar5);
                xmlXPtrFreeLocationSet(val);
                iStack_30 = 0x10;
                goto LAB_001e16c3;
              }
            }
            else if (*piVar3 == 5) {
              node = *(xmlNodePtr *)(piVar3 + 10);
              indx = piVar3[0xc];
LAB_001e1665:
              pxVar4 = xmlXPtrNewPoint(node,indx);
              if (pxVar4 != (xmlXPathObjectPtr)0x0) {
                xmlXPtrLocationSetAdd(val,pxVar4);
              }
            }
          }
        }
      }
      xmlXPathFreeObject(pxVar5);
      pxVar5 = xmlXPtrWrapLocationSet(val);
      valuePush(ctxt,pxVar5);
      return;
    }
    xmlXPathFreeObject(pxVar5);
  }
  iStack_30 = 0xf;
LAB_001e16c3:
  xmlXPathErr(ctxt,iStack_30);
  return;
}

Assistant:

static void
xmlXPtrEndPointFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr tmp, obj, point;
    xmlLocationSetPtr newset = NULL;
    xmlLocationSetPtr oldset = NULL;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET)))
        XP_ERROR(XPATH_INVALID_TYPE)

    obj = valuePop(ctxt);
    if (obj->type == XPATH_NODESET) {
	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(obj->nodesetval);
	xmlXPathFreeObject(obj);
	if (tmp == NULL)
            XP_ERROR(XPATH_MEMORY_ERROR)
	obj = tmp;
    }

    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
	xmlXPathFreeObject(obj);
        XP_ERROR(XPATH_MEMORY_ERROR);
    }
    oldset = (xmlLocationSetPtr) obj->user;
    if (oldset != NULL) {
	int i;

	for (i = 0; i < oldset->locNr; i++) {
	    tmp = oldset->locTab[i];
	    if (tmp == NULL)
		continue;
	    point = NULL;
	    switch (tmp->type) {
		case XPATH_POINT:
		    point = xmlXPtrNewPoint(tmp->user, tmp->index);
		    break;
		case XPATH_RANGE: {
		    xmlNodePtr node = tmp->user2;
		    if (node != NULL) {
			if ((node->type == XML_ATTRIBUTE_NODE) ||
                            (node->type == XML_NAMESPACE_DECL)) {
			    xmlXPathFreeObject(obj);
			    xmlXPtrFreeLocationSet(newset);
			    XP_ERROR(XPTR_SYNTAX_ERROR);
			}
			point = xmlXPtrNewPoint(node, tmp->index2);
		    } else if (tmp->user == NULL) {
			point = xmlXPtrNewPoint(node,
				       xmlXPtrNbLocChildren(node));
		    }
		    break;
	        }
		default:
		    /*** Should we raise an error ?
		    xmlXPathFreeObject(obj);
		    xmlXPathFreeObject(newset);
		    XP_ERROR(XPATH_INVALID_TYPE)
		    ***/
		    break;
	    }
            if (point != NULL)
		xmlXPtrLocationSetAdd(newset, point);
	}
    }
    xmlXPathFreeObject(obj);
    valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
}